

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Ref<embree::Geometry> *pRVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  int iVar22;
  undefined1 (*pauVar23) [16];
  byte bVar24;
  AABBNodeMB4D *node1;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  float fVar100;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar101 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar118 [32];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1390;
  undefined8 uStack_1388;
  ulong local_1380;
  ulong local_1378;
  ulong local_1370;
  undefined1 (*local_1368) [16];
  long local_1360;
  ulong local_1358;
  ulong local_1350;
  long local_1348;
  RTCFilterFunctionNArguments local_1340;
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  float local_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  undefined1 local_1270 [16];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  RTCHitN local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined4 local_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  uint local_11a0;
  uint uStack_119c;
  uint uStack_1198;
  uint uStack_1194;
  uint uStack_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1368 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_1300 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar127 = ZEXT1664(local_1300);
  local_1310 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar128 = ZEXT1664(local_1310);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1270._4_4_ = uVar1;
  local_1270._0_4_ = uVar1;
  local_1270._8_4_ = uVar1;
  local_1270._12_4_ = uVar1;
  auVar99 = ZEXT1664(local_1270);
  local_12b0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_12c0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_12d0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1280 = local_12b0 * 0.99999964;
  local_1290 = local_12c0 * 0.99999964;
  local_12a0 = local_12d0 * 0.99999964;
  local_12b0 = local_12b0 * 1.0000004;
  local_12c0 = local_12c0 * 1.0000004;
  local_12d0 = local_12d0 * 1.0000004;
  local_1378 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1380 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = local_1378 ^ 0x10;
  local_1350 = local_1380 ^ 0x10;
  local_1370 = uVar31 ^ 0x10;
  local_12e0 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar126 = ZEXT1664(local_12e0);
  iVar30 = (tray->tfar).field_0.i[k];
  auVar92 = ZEXT1664(CONCAT412(iVar30,CONCAT48(iVar30,CONCAT44(iVar30,iVar30))));
  local_12f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  uVar34 = local_1378;
  uVar39 = local_1380;
  fVar100 = local_1280;
  fVar102 = local_1280;
  fVar103 = local_1280;
  fVar104 = local_1280;
  fVar105 = local_1290;
  fVar106 = local_1290;
  fVar107 = local_1290;
  fVar108 = local_1290;
  fVar109 = local_12a0;
  fVar110 = local_12a0;
  fVar111 = local_12a0;
  fVar112 = local_12a0;
  fVar113 = local_12b0;
  fVar114 = local_12b0;
  fVar115 = local_12b0;
  fVar116 = local_12b0;
  fVar117 = local_12c0;
  fVar119 = local_12c0;
  fVar120 = local_12c0;
  fVar121 = local_12c0;
  fVar122 = local_12d0;
  fVar123 = local_12d0;
  fVar124 = local_12d0;
  fVar125 = local_12d0;
  local_1358 = local_1370;
  fStack_12cc = local_12d0;
  fStack_12c8 = local_12d0;
  fStack_12c4 = local_12d0;
  fStack_12bc = local_12c0;
  fStack_12b8 = local_12c0;
  fStack_12b4 = local_12c0;
  fStack_12ac = local_12b0;
  fStack_12a8 = local_12b0;
  fStack_12a4 = local_12b0;
  fStack_129c = local_12a0;
  fStack_1298 = local_12a0;
  fStack_1294 = local_12a0;
  fStack_128c = local_1290;
  fStack_1288 = local_1290;
  fStack_1284 = local_1290;
  fStack_127c = local_1280;
  fStack_1278 = local_1280;
  fStack_1274 = local_1280;
  do {
    do {
      do {
        if (local_1368 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar23 = local_1368 + -1;
        local_1368 = local_1368 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar23 + 8));
      sVar33 = *(size_t *)*local_1368;
      do {
        if ((sVar33 & 8) == 0) {
          uVar25 = sVar33 & 0xfffffffffffffff0;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar34),auVar54,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar34));
          auVar40 = vsubps_avx512vl(auVar40,auVar127._0_16_);
          auVar41._0_4_ = fVar100 * auVar40._0_4_;
          auVar41._4_4_ = fVar102 * auVar40._4_4_;
          auVar41._8_4_ = fVar103 * auVar40._8_4_;
          auVar41._12_4_ = fVar104 * auVar40._12_4_;
          auVar41 = vmaxps_avx512vl(auVar126._0_16_,auVar41);
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar39),auVar54,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar39));
          auVar40 = vsubps_avx512vl(auVar40,auVar128._0_16_);
          auVar51._0_4_ = fVar105 * auVar40._0_4_;
          auVar51._4_4_ = fVar106 * auVar40._4_4_;
          auVar51._8_4_ = fVar107 * auVar40._8_4_;
          auVar51._12_4_ = fVar108 * auVar40._12_4_;
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar31),auVar54,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar31));
          auVar40 = vsubps_avx(auVar40,auVar99._0_16_);
          auVar60._0_4_ = fVar109 * auVar40._0_4_;
          auVar60._4_4_ = fVar110 * auVar40._4_4_;
          auVar60._8_4_ = fVar111 * auVar40._8_4_;
          auVar60._12_4_ = fVar112 * auVar40._12_4_;
          auVar40 = vmaxps_avx(auVar51,auVar60);
          auVar40 = vmaxps_avx(auVar41,auVar40);
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + uVar36),auVar54,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + uVar36));
          auVar41 = vsubps_avx512vl(auVar41,auVar127._0_16_);
          auVar57._0_4_ = fVar113 * auVar41._0_4_;
          auVar57._4_4_ = fVar114 * auVar41._4_4_;
          auVar57._8_4_ = fVar115 * auVar41._8_4_;
          auVar57._12_4_ = fVar116 * auVar41._12_4_;
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + local_1350),auVar54,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + local_1350));
          auVar41 = vsubps_avx512vl(auVar41,auVar128._0_16_);
          auVar67._0_4_ = fVar117 * auVar41._0_4_;
          auVar67._4_4_ = fVar119 * auVar41._4_4_;
          auVar67._8_4_ = fVar120 * auVar41._8_4_;
          auVar67._12_4_ = fVar121 * auVar41._12_4_;
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80 + local_1358),auVar54,
                                    *(undefined1 (*) [16])(uVar25 + 0x20 + local_1358));
          auVar41 = vsubps_avx(auVar41,auVar99._0_16_);
          auVar63._0_4_ = fVar122 * auVar41._0_4_;
          auVar63._4_4_ = fVar123 * auVar41._4_4_;
          auVar63._8_4_ = fVar124 * auVar41._8_4_;
          auVar63._12_4_ = fVar125 * auVar41._12_4_;
          auVar41 = vminps_avx(auVar67,auVar63);
          auVar51 = vminps_avx(auVar92._0_16_,auVar57);
          auVar41 = vminps_avx(auVar51,auVar41);
          local_1370 = vcmpps_avx512vl(auVar40,auVar41,2);
          if (((uint)sVar33 & 7) == 6) {
            uVar13 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
            uVar14 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
            local_1370 = (ulong)(byte)((byte)uVar13 & (byte)uVar14 & (byte)local_1370);
          }
          local_1180._0_16_ = auVar40;
        }
        if ((sVar33 & 8) == 0) {
          if (local_1370 == 0) {
            iVar30 = 4;
          }
          else {
            uVar32 = sVar33 & 0xfffffffffffffff0;
            lVar16 = 0;
            for (uVar25 = local_1370; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
            {
              lVar16 = lVar16 + 1;
            }
            iVar30 = 0;
            uVar25 = local_1370 - 1 & local_1370;
            sVar33 = *(ulong *)(uVar32 + lVar16 * 8);
            if (uVar25 != 0) {
              uVar15 = *(uint *)(local_1180 + lVar16 * 4);
              lVar16 = 0;
              for (uVar35 = uVar25; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                lVar16 = lVar16 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              uVar35 = *(ulong *)(uVar32 + lVar16 * 8);
              uVar28 = *(uint *)(local_1180 + lVar16 * 4);
              if (uVar25 == 0) {
                if (uVar15 < uVar28) {
                  *(ulong *)*local_1368 = uVar35;
                  *(uint *)((long)*local_1368 + 8) = uVar28;
                  local_1368 = local_1368 + 1;
                }
                else {
                  *(size_t *)*local_1368 = sVar33;
                  *(uint *)((long)*local_1368 + 8) = uVar15;
                  sVar33 = uVar35;
                  local_1368 = local_1368 + 1;
                }
              }
              else {
                auVar40._8_8_ = 0;
                auVar40._0_8_ = sVar33;
                auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar15));
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar35;
                auVar41 = vpunpcklqdq_avx(auVar68,ZEXT416(uVar28));
                lVar16 = 0;
                for (uVar35 = uVar25; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000)
                {
                  lVar16 = lVar16 + 1;
                }
                uVar25 = uVar25 - 1 & uVar25;
                auVar65._8_8_ = 0;
                auVar65._0_8_ = *(ulong *)(uVar32 + lVar16 * 8);
                auVar60 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_1180 + lVar16 * 4)));
                auVar51 = vpshufd_avx(auVar40,0xaa);
                auVar54 = vpshufd_avx(auVar41,0xaa);
                auVar57 = vpshufd_avx(auVar60,0xaa);
                if (uVar25 == 0) {
                  uVar25 = vpcmpgtd_avx512vl(auVar54,auVar51);
                  uVar25 = uVar25 & 0xf;
                  auVar54 = vpblendmd_avx512vl(auVar41,auVar40);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar62._0_4_ = (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar51._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar62._4_4_ = (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar51._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar62._8_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar51._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar62._12_4_ = (uint)bVar12 * auVar54._12_4_ | (uint)!bVar12 * auVar51._12_4_;
                  auVar41 = vmovdqa32_avx512vl(auVar41);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar48._0_4_ = (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar48._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar40._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar48._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar40._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar48._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar40._12_4_;
                  auVar40 = vpshufd_avx(auVar62,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar57,auVar40);
                  uVar25 = uVar25 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar60,auVar62);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  sVar33 = CONCAT44((uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_,
                                    (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_);
                  auVar40 = vmovdqa32_avx512vl(auVar60);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar42._0_4_ = (uint)bVar12 * auVar40._0_4_ | !bVar12 * auVar62._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar42._4_4_ = (uint)bVar12 * auVar40._4_4_ | !bVar12 * auVar62._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar42._8_4_ = (uint)bVar12 * auVar40._8_4_ | !bVar12 * auVar62._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar42._12_4_ = (uint)bVar12 * auVar40._12_4_ | !bVar12 * auVar62._12_4_;
                  auVar40 = vpshufd_avx(auVar42,0xaa);
                  auVar41 = vpshufd_avx(auVar48,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar40,auVar41);
                  uVar25 = uVar25 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar42,auVar48);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar50._0_4_ = (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar50._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar40._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar50._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar40._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar50._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar40._12_4_;
                  auVar40 = vmovdqa32_avx512vl(auVar42);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar43._0_4_ = (uint)bVar12 * auVar40._0_4_ | !bVar12 * auVar48._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar43._4_4_ = (uint)bVar12 * auVar40._4_4_ | !bVar12 * auVar48._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar43._8_4_ = (uint)bVar12 * auVar40._8_4_ | !bVar12 * auVar48._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar43._12_4_ = (uint)bVar12 * auVar40._12_4_ | !bVar12 * auVar48._12_4_;
                  *local_1368 = auVar43;
                  local_1368[1] = auVar50;
                  local_1368 = local_1368 + 2;
                }
                else {
                  lVar16 = 0;
                  for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                    lVar16 = lVar16 + 1;
                  }
                  uVar15 = *(uint *)(local_1180 + lVar16 * 4);
                  auVar58._8_8_ = 0;
                  auVar58._0_8_ = *(ulong *)(uVar32 + lVar16 * 8);
                  auVar67 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar15));
                  uVar25 = vpcmpgtd_avx512vl(auVar54,auVar51);
                  uVar25 = uVar25 & 0xf;
                  auVar54 = vpblendmd_avx512vl(auVar41,auVar40);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar53._0_4_ = (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar51._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar51._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar51._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar53._12_4_ = (uint)bVar12 * auVar54._12_4_ | (uint)!bVar12 * auVar51._12_4_;
                  auVar41 = vmovdqa32_avx512vl(auVar41);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar56._0_4_ = (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar40._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar40._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar56._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar40._12_4_;
                  auVar55._4_4_ = uVar15;
                  auVar55._0_4_ = uVar15;
                  auVar55._8_4_ = uVar15;
                  auVar55._12_4_ = uVar15;
                  uVar25 = vpcmpgtd_avx512vl(auVar55,auVar57);
                  uVar25 = uVar25 & 0xf;
                  auVar40 = vpblendmd_avx512vl(auVar67,auVar60);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar59._0_4_ = (uint)bVar12 * auVar40._0_4_ | !bVar12 * uVar15;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar12 * auVar40._4_4_ | !bVar12 * uVar15;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar12 * auVar40._8_4_ | !bVar12 * uVar15;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar59._12_4_ = (uint)bVar12 * auVar40._12_4_ | !bVar12 * uVar15;
                  auVar40 = vmovdqa32_avx512vl(auVar67);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar61._0_4_ = (uint)bVar12 * auVar40._0_4_ | (uint)!bVar12 * auVar60._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar61._4_4_ = (uint)bVar12 * auVar40._4_4_ | (uint)!bVar12 * auVar60._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar61._8_4_ = (uint)bVar12 * auVar40._8_4_ | (uint)!bVar12 * auVar60._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar61._12_4_ = (uint)bVar12 * auVar40._12_4_ | (uint)!bVar12 * auVar60._12_4_;
                  auVar40 = vpshufd_avx(auVar61,0xaa);
                  auVar41 = vpshufd_avx(auVar56,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar40,auVar41);
                  uVar25 = uVar25 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar61,auVar56);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar44._0_4_ = (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar44._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar40._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar44._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar40._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar44._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar40._12_4_;
                  auVar40 = vmovdqa32_avx512vl(auVar61);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar64._0_4_ = (uint)bVar12 * auVar40._0_4_ | !bVar12 * auVar56._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar64._4_4_ = (uint)bVar12 * auVar40._4_4_ | !bVar12 * auVar56._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar64._8_4_ = (uint)bVar12 * auVar40._8_4_ | !bVar12 * auVar56._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar64._12_4_ = (uint)bVar12 * auVar40._12_4_ | !bVar12 * auVar56._12_4_;
                  auVar40 = vpshufd_avx(auVar59,0xaa);
                  auVar41 = vpshufd_avx(auVar53,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar40,auVar41);
                  uVar25 = uVar25 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar59,auVar53);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
                  sVar33 = CONCAT44((uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar40._4_4_,
                                    (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_);
                  auVar40 = vmovdqa32_avx512vl(auVar59);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar45._0_4_ = (uint)bVar12 * auVar40._0_4_ | !bVar12 * auVar53._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar45._4_4_ = (uint)bVar12 * auVar40._4_4_ | !bVar12 * auVar53._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar45._8_4_ = (uint)bVar12 * auVar40._8_4_ | !bVar12 * auVar53._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar45._12_4_ = (uint)bVar12 * auVar40._12_4_ | !bVar12 * auVar53._12_4_;
                  auVar40 = vpshufd_avx(auVar45,0xaa);
                  auVar41 = vpshufd_avx(auVar44,0xaa);
                  uVar25 = vpcmpgtd_avx512vl(auVar41,auVar40);
                  uVar25 = uVar25 & 0xf;
                  auVar41 = vpblendmd_avx512vl(auVar44,auVar45);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar66._0_4_ = (uint)bVar12 * auVar41._0_4_ | (uint)!bVar12 * auVar40._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar66._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * auVar40._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar66._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * auVar40._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar66._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * auVar40._12_4_;
                  auVar40 = vmovdqa32_avx512vl(auVar44);
                  bVar12 = (bool)((byte)uVar25 & 1);
                  auVar52._0_4_ = (uint)bVar12 * auVar40._0_4_ | !bVar12 * auVar45._0_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar12 * auVar40._4_4_ | !bVar12 * auVar45._4_4_;
                  bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar12 * auVar40._8_4_ | !bVar12 * auVar45._8_4_;
                  bVar12 = SUB81(uVar25 >> 3,0);
                  auVar52._12_4_ = (uint)bVar12 * auVar40._12_4_ | !bVar12 * auVar45._12_4_;
                  *local_1368 = auVar64;
                  local_1368[1] = auVar52;
                  local_1368[2] = auVar66;
                  local_1368 = local_1368 + 3;
                }
              }
            }
          }
        }
        else {
          iVar30 = 6;
        }
      } while (iVar30 == 0);
    } while (iVar30 != 6);
    local_1360 = (ulong)((uint)sVar33 & 0xf) - 8;
    if (local_1360 != 0) {
      uVar34 = sVar33 & 0xfffffffffffffff0;
      local_1348 = 0;
      do {
        lVar26 = local_1348 * 0x60;
        pSVar4 = context->scene;
        pRVar5 = (pSVar4->geometries).items;
        pGVar6 = pRVar5[*(uint *)(uVar34 + 0x40 + lVar26)].ptr;
        fVar100 = (pGVar6->time_range).lower;
        fVar100 = pGVar6->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar100) /
                  ((pGVar6->time_range).upper - fVar100));
        auVar40 = vroundss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),9);
        auVar40 = vminss_avx(auVar40,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
        auVar43 = vmaxss_avx(ZEXT816(0),auVar40);
        iVar30 = (int)auVar43._0_4_;
        lVar29 = (long)iVar30 * 0x38;
        lVar16 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar29);
        auVar40 = *(undefined1 (*) [16])(lVar16 + (ulong)*(uint *)(uVar34 + lVar26) * 4);
        uVar32 = (ulong)*(uint *)(uVar34 + 0x10 + lVar26);
        auVar41 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
        uVar25 = (ulong)*(uint *)(uVar34 + 0x20 + lVar26);
        auVar51 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
        uVar35 = (ulong)*(uint *)(uVar34 + 0x30 + lVar26);
        auVar54 = *(undefined1 (*) [16])(lVar16 + uVar35 * 4);
        uVar39 = (ulong)*(uint *)(uVar34 + 4 + lVar26);
        lVar37 = (long)(iVar30 + 1) * 0x38;
        lVar16 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar37);
        auVar57 = *(undefined1 (*) [16])(lVar16 + (ulong)*(uint *)(uVar34 + lVar26) * 4);
        auVar60 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
        lVar7 = *(long *)&pRVar5[*(uint *)(uVar34 + 0x44 + lVar26)].ptr[2].numPrimitives;
        lVar8 = *(long *)(lVar7 + lVar29);
        auVar67 = *(undefined1 (*) [16])(lVar8 + uVar39 * 4);
        auVar63 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
        uVar32 = (ulong)*(uint *)(uVar34 + 0x14 + lVar26);
        auVar68 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
        auVar65 = *(undefined1 (*) [16])(lVar16 + uVar35 * 4);
        uVar25 = (ulong)*(uint *)(uVar34 + 0x24 + lVar26);
        auVar53 = *(undefined1 (*) [16])(lVar8 + uVar25 * 4);
        uVar35 = (ulong)*(uint *)(uVar34 + 0x34 + lVar26);
        auVar56 = *(undefined1 (*) [16])(lVar8 + uVar35 * 4);
        lVar16 = *(long *)&pRVar5[*(uint *)(uVar34 + 0x48 + lVar26)].ptr[2].numPrimitives;
        lVar7 = *(long *)(lVar7 + lVar37);
        auVar59 = *(undefined1 (*) [16])(lVar7 + uVar39 * 4);
        lVar8 = *(long *)(lVar16 + lVar29);
        auVar61 = *(undefined1 (*) [16])(lVar7 + uVar32 * 4);
        uVar32 = (ulong)*(uint *)(uVar34 + 8 + lVar26);
        auVar44 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
        auVar64 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
        uVar39 = (ulong)*(uint *)(uVar34 + 0x18 + lVar26);
        auVar45 = *(undefined1 (*) [16])(lVar8 + uVar39 * 4);
        auVar66 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
        uVar25 = (ulong)*(uint *)(uVar34 + 0x28 + lVar26);
        auVar52 = *(undefined1 (*) [16])(lVar8 + uVar25 * 4);
        uVar38 = (ulong)*(uint *)(uVar34 + 0x38 + lVar26);
        auVar55 = *(undefined1 (*) [16])(lVar8 + uVar38 * 4);
        lVar16 = *(long *)(lVar16 + lVar37);
        auVar58 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
        lVar7 = *(long *)&pRVar5[*(uint *)(uVar34 + 0x4c + lVar26)].ptr[2].numPrimitives;
        lVar8 = *(long *)(lVar7 + lVar29);
        auVar62 = *(undefined1 (*) [16])(lVar16 + uVar39 * 4);
        uVar35 = (ulong)*(uint *)(uVar34 + 0xc + lVar26);
        auVar48 = *(undefined1 (*) [16])(lVar8 + uVar35 * 4);
        auVar42 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
        uVar25 = (ulong)*(uint *)(uVar34 + 0x1c + lVar26);
        auVar50 = *(undefined1 (*) [16])(lVar8 + uVar25 * 4);
        auVar46 = vunpcklps_avx512vl(auVar40,auVar44);
        auVar44 = vunpckhps_avx(auVar40,auVar44);
        auVar47 = vunpcklps_avx512vl(auVar67,auVar48);
        auVar67 = vunpckhps_avx(auVar67,auVar48);
        auVar40 = *(undefined1 (*) [16])(lVar16 + uVar38 * 4);
        uVar39 = (ulong)*(uint *)(uVar34 + 0x2c + lVar26);
        auVar44 = vunpcklps_avx(auVar44,auVar67);
        auVar48 = vunpcklps_avx512vl(auVar46,auVar47);
        auVar46 = vunpckhps_avx512vl(auVar46,auVar47);
        auVar47 = vunpcklps_avx512vl(auVar41,auVar45);
        auVar49 = vunpckhps_avx512vl(auVar41,auVar45);
        auVar45 = vunpcklps_avx(auVar68,auVar50);
        auVar67 = vunpckhps_avx(auVar68,auVar50);
        auVar41 = *(undefined1 (*) [16])(lVar8 + uVar39 * 4);
        uVar32 = (ulong)*(uint *)(uVar34 + 0x3c + lVar26);
        auVar68 = vunpcklps_avx(auVar49,auVar67);
        auVar50 = vunpcklps_avx512vl(auVar47,auVar45);
        auVar67 = vunpckhps_avx(auVar47,auVar45);
        auVar47 = vunpcklps_avx512vl(auVar51,auVar52);
        auVar51 = vunpckhps_avx512vl(auVar51,auVar52);
        auVar52 = vunpcklps_avx512vl(auVar53,auVar41);
        auVar53 = vunpckhps_avx512vl(auVar53,auVar41);
        auVar41 = *(undefined1 (*) [16])(lVar8 + uVar32 * 4);
        lVar16 = *(long *)(lVar7 + lVar37);
        auVar53 = vunpcklps_avx(auVar51,auVar53);
        auVar45 = vunpcklps_avx(auVar47,auVar52);
        auVar51 = vunpckhps_avx(auVar47,auVar52);
        auVar52 = vunpcklps_avx512vl(auVar54,auVar55);
        auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
        auVar55 = vunpcklps_avx512vl(auVar56,auVar41);
        auVar56 = vunpckhps_avx512vl(auVar56,auVar41);
        auVar41 = *(undefined1 (*) [16])(lVar16 + uVar35 * 4);
        auVar54 = vunpcklps_avx(auVar54,auVar56);
        auVar56 = vunpcklps_avx512vl(auVar52,auVar55);
        auVar52 = vunpckhps_avx512vl(auVar52,auVar55);
        auVar55 = vunpcklps_avx512vl(auVar57,auVar58);
        auVar57 = vunpckhps_avx512vl(auVar57,auVar58);
        auVar58 = vunpcklps_avx512vl(auVar59,auVar41);
        auVar59 = vunpckhps_avx512vl(auVar59,auVar41);
        auVar41 = *(undefined1 (*) [16])(lVar16 + uVar25 * 4);
        auVar59 = vunpcklps_avx512vl(auVar57,auVar59);
        auVar47 = vunpcklps_avx512vl(auVar55,auVar58);
        auVar55 = vunpckhps_avx512vl(auVar55,auVar58);
        auVar57 = vunpcklps_avx512vl(auVar60,auVar62);
        auVar60 = vunpckhps_avx512vl(auVar60,auVar62);
        auVar58 = vunpcklps_avx512vl(auVar61,auVar41);
        auVar61 = vunpckhps_avx512vl(auVar61,auVar41);
        auVar41 = *(undefined1 (*) [16])(lVar16 + uVar39 * 4);
        auVar60 = vunpcklps_avx512vl(auVar60,auVar61);
        auVar61 = vunpcklps_avx512vl(auVar57,auVar58);
        auVar58 = vunpckhps_avx512vl(auVar57,auVar58);
        auVar62 = vunpcklps_avx512vl(auVar63,auVar42);
        auVar57 = vunpckhps_avx512vl(auVar63,auVar42);
        auVar63 = vunpcklps_avx512vl(auVar64,auVar41);
        auVar64 = vunpckhps_avx512vl(auVar64,auVar41);
        auVar41 = *(undefined1 (*) [16])(lVar16 + uVar32 * 4);
        auVar57 = vunpcklps_avx(auVar57,auVar64);
        auVar64 = vunpcklps_avx512vl(auVar62,auVar63);
        auVar63 = vunpckhps_avx512vl(auVar62,auVar63);
        auVar62 = vunpcklps_avx512vl(auVar65,auVar40);
        auVar40 = vunpckhps_avx512vl(auVar65,auVar40);
        auVar65 = vunpcklps_avx512vl(auVar66,auVar41);
        auVar41 = vunpckhps_avx512vl(auVar66,auVar41);
        auVar40 = vunpcklps_avx(auVar40,auVar41);
        auVar66 = vunpcklps_avx512vl(auVar62,auVar65);
        auVar65 = vunpckhps_avx512vl(auVar62,auVar65);
        auVar41 = ZEXT416((uint)(fVar100 - auVar43._0_4_));
        auVar62 = vbroadcastss_avx512vl(auVar41);
        auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar41);
        auVar49._0_4_ = auVar41._0_4_;
        auVar49._4_4_ = auVar49._0_4_;
        auVar49._8_4_ = auVar49._0_4_;
        auVar49._12_4_ = auVar49._0_4_;
        auVar41 = vmulps_avx512vl(auVar62,auVar47);
        auVar48 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar48);
        auVar41 = vmulps_avx512vl(auVar62,auVar55);
        auVar55 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar46);
        auVar41 = vmulps_avx512vl(auVar62,auVar59);
        auVar41 = vfmadd231ps_fma(auVar41,auVar49,auVar44);
        auVar59 = vmulps_avx512vl(auVar62,auVar61);
        auVar59 = vfmadd231ps_avx512vl(auVar59,auVar49,auVar50);
        auVar69 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar34 + 0x10 + lVar26));
        local_fc0 = vmovdqa64_avx512vl(auVar69);
        auVar69 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar34 + 0x14 + lVar26));
        auVar61 = vmulps_avx512vl(auVar62,auVar58);
        auVar60 = vmulps_avx512vl(auVar62,auVar60);
        auVar61 = vfmadd231ps_avx512vl(auVar61,auVar49,auVar67);
        auVar60 = vfmadd231ps_fma(auVar60,auVar49,auVar68);
        auVar67 = vmulps_avx512vl(auVar62,auVar64);
        auVar63 = vmulps_avx512vl(auVar62,auVar63);
        auVar68 = vmulps_avx512vl(auVar62,auVar57);
        auVar57 = vfmadd231ps_fma(auVar67,auVar49,auVar45);
        auVar51 = vfmadd231ps_fma(auVar63,auVar49,auVar51);
        auVar67 = vfmadd231ps_fma(auVar68,auVar49,auVar53);
        auVar63 = vmulps_avx512vl(auVar62,auVar66);
        auVar68 = vmulps_avx512vl(auVar62,auVar65);
        auVar65 = vmulps_avx512vl(auVar62,auVar40);
        auVar40 = vfmadd231ps_fma(auVar63,auVar49,auVar56);
        auVar63 = vfmadd231ps_fma(auVar68,auVar49,auVar52);
        auVar54 = vfmadd231ps_fma(auVar65,auVar49,auVar54);
        local_1240 = vmovdqa64_avx512vl(auVar69);
        auVar69 = vinsertf32x4_avx512vl(ZEXT1632(auVar48),auVar57,1);
        auVar70 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar51,1);
        auVar73._16_16_ = auVar67;
        auVar73._0_16_ = auVar41;
        auVar80._16_16_ = auVar59;
        auVar80._0_16_ = auVar59;
        auVar71 = vinsertf32x4_avx512vl(ZEXT1632(auVar61),auVar61,1);
        auVar79._16_16_ = auVar60;
        auVar79._0_16_ = auVar60;
        auVar77._16_16_ = auVar40;
        auVar77._0_16_ = auVar40;
        auVar81._16_16_ = auVar63;
        auVar81._0_16_ = auVar63;
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar82._4_4_ = uVar1;
        auVar82._0_4_ = uVar1;
        auVar82._8_4_ = uVar1;
        auVar82._12_4_ = uVar1;
        auVar82._16_4_ = uVar1;
        auVar82._20_4_ = uVar1;
        auVar82._24_4_ = uVar1;
        auVar82._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar83._4_4_ = uVar1;
        auVar83._0_4_ = uVar1;
        auVar83._8_4_ = uVar1;
        auVar83._12_4_ = uVar1;
        auVar83._16_4_ = uVar1;
        auVar83._20_4_ = uVar1;
        auVar83._24_4_ = uVar1;
        auVar83._28_4_ = uVar1;
        auVar72 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar93._4_4_ = uVar1;
        auVar93._0_4_ = uVar1;
        auVar93._8_4_ = uVar1;
        auVar93._12_4_ = uVar1;
        auVar93._16_4_ = uVar1;
        auVar93._20_4_ = uVar1;
        auVar93._24_4_ = uVar1;
        auVar93._28_4_ = uVar1;
        auVar78._16_16_ = auVar54;
        auVar78._0_16_ = auVar54;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar95._4_4_ = uVar1;
        auVar95._0_4_ = uVar1;
        auVar95._8_4_ = uVar1;
        auVar95._12_4_ = uVar1;
        auVar95._16_4_ = uVar1;
        auVar95._20_4_ = uVar1;
        auVar95._24_4_ = uVar1;
        auVar95._28_4_ = uVar1;
        fVar100 = *(float *)(ray + k * 4 + 0x60);
        auVar98._4_4_ = fVar100;
        auVar98._0_4_ = fVar100;
        auVar98._8_4_ = fVar100;
        auVar98._12_4_ = fVar100;
        auVar98._16_4_ = fVar100;
        auVar98._20_4_ = fVar100;
        auVar98._24_4_ = fVar100;
        auVar98._28_4_ = fVar100;
        auVar69 = vsubps_avx(auVar69,auVar82);
        auVar70 = vsubps_avx(auVar70,auVar83);
        auVar73 = vsubps_avx512vl(auVar73,auVar72);
        auVar74 = vsubps_avx512vl(auVar80,auVar82);
        auVar75 = vsubps_avx512vl(auVar71,auVar83);
        auVar76 = vsubps_avx512vl(auVar79,auVar72);
        auVar71 = vsubps_avx(auVar77,auVar82);
        auVar77 = vsubps_avx512vl(auVar81,auVar83);
        auVar78 = vsubps_avx512vl(auVar78,auVar72);
        auVar72 = vsubps_avx(auVar71,auVar69);
        auVar79 = vsubps_avx512vl(auVar77,auVar70);
        auVar80 = vsubps_avx512vl(auVar78,auVar73);
        auVar81 = vsubps_avx512vl(auVar69,auVar74);
        auVar82 = vsubps_avx512vl(auVar70,auVar75);
        auVar83 = vsubps_avx512vl(auVar73,auVar76);
        auVar88._0_4_ = auVar71._0_4_ + auVar69._0_4_;
        auVar88._4_4_ = auVar71._4_4_ + auVar69._4_4_;
        auVar88._8_4_ = auVar71._8_4_ + auVar69._8_4_;
        auVar88._12_4_ = auVar71._12_4_ + auVar69._12_4_;
        auVar88._16_4_ = auVar71._16_4_ + auVar69._16_4_;
        auVar88._20_4_ = auVar71._20_4_ + auVar69._20_4_;
        auVar88._24_4_ = auVar71._24_4_ + auVar69._24_4_;
        auVar88._28_4_ = auVar71._28_4_ + auVar69._28_4_;
        auVar84 = vaddps_avx512vl(auVar77,auVar70);
        auVar85 = vaddps_avx512vl(auVar78,auVar73);
        auVar86._4_4_ = auVar80._4_4_ * auVar84._4_4_;
        auVar86._0_4_ = auVar80._0_4_ * auVar84._0_4_;
        auVar86._8_4_ = auVar80._8_4_ * auVar84._8_4_;
        auVar86._12_4_ = auVar80._12_4_ * auVar84._12_4_;
        auVar86._16_4_ = auVar80._16_4_ * auVar84._16_4_;
        auVar86._20_4_ = auVar80._20_4_ * auVar84._20_4_;
        auVar86._24_4_ = auVar80._24_4_ * auVar84._24_4_;
        auVar86._28_4_ = auVar67._12_4_;
        auVar41 = vfmsub231ps_fma(auVar86,auVar79,auVar85);
        auVar87._4_4_ = auVar72._4_4_ * auVar85._4_4_;
        auVar87._0_4_ = auVar72._0_4_ * auVar85._0_4_;
        auVar87._8_4_ = auVar72._8_4_ * auVar85._8_4_;
        auVar87._12_4_ = auVar72._12_4_ * auVar85._12_4_;
        auVar87._16_4_ = auVar72._16_4_ * auVar85._16_4_;
        auVar87._20_4_ = auVar72._20_4_ * auVar85._20_4_;
        auVar87._24_4_ = auVar72._24_4_ * auVar85._24_4_;
        auVar87._28_4_ = auVar85._28_4_;
        auVar40 = vfmsub231ps_fma(auVar87,auVar80,auVar88);
        auVar85._4_4_ = auVar79._4_4_ * auVar88._4_4_;
        auVar85._0_4_ = auVar79._0_4_ * auVar88._0_4_;
        auVar85._8_4_ = auVar79._8_4_ * auVar88._8_4_;
        auVar85._12_4_ = auVar79._12_4_ * auVar88._12_4_;
        auVar85._16_4_ = auVar79._16_4_ * auVar88._16_4_;
        auVar85._20_4_ = auVar79._20_4_ * auVar88._20_4_;
        auVar85._24_4_ = auVar79._24_4_ * auVar88._24_4_;
        auVar85._28_4_ = auVar88._28_4_;
        auVar51 = vfmsub231ps_fma(auVar85,auVar72,auVar84);
        auVar90._0_4_ = fVar100 * auVar51._0_4_;
        auVar90._4_4_ = fVar100 * auVar51._4_4_;
        auVar90._8_4_ = fVar100 * auVar51._8_4_;
        auVar90._12_4_ = fVar100 * auVar51._12_4_;
        auVar90._16_4_ = fVar100 * 0.0;
        auVar90._20_4_ = fVar100 * 0.0;
        auVar90._24_4_ = fVar100 * 0.0;
        auVar90._28_4_ = 0;
        auVar40 = vfmadd231ps_fma(auVar90,auVar95,ZEXT1632(auVar40));
        auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar93,ZEXT1632(auVar41));
        auVar86 = vaddps_avx512vl(auVar69,auVar74);
        auVar87 = vaddps_avx512vl(auVar70,auVar75);
        auVar85 = vaddps_avx512vl(auVar73,auVar76);
        auVar84 = vmulps_avx512vl(auVar87,auVar83);
        auVar88 = vfmsub231ps_avx512vl(auVar84,auVar82,auVar85);
        auVar84._4_4_ = auVar85._4_4_ * auVar81._4_4_;
        auVar84._0_4_ = auVar85._0_4_ * auVar81._0_4_;
        auVar84._8_4_ = auVar85._8_4_ * auVar81._8_4_;
        auVar84._12_4_ = auVar85._12_4_ * auVar81._12_4_;
        auVar84._16_4_ = auVar85._16_4_ * auVar81._16_4_;
        auVar84._20_4_ = auVar85._20_4_ * auVar81._20_4_;
        auVar84._24_4_ = auVar85._24_4_ * auVar81._24_4_;
        auVar84._28_4_ = auVar85._28_4_;
        auVar85 = vfmsub231ps_avx512vl(auVar84,auVar83,auVar86);
        auVar86 = vmulps_avx512vl(auVar86,auVar82);
        auVar41 = vfmsub231ps_fma(auVar86,auVar81,auVar87);
        auVar86 = vsubps_avx512vl(auVar74,auVar71);
        auVar101._0_4_ = auVar41._0_4_ * fVar100;
        auVar101._4_4_ = auVar41._4_4_ * fVar100;
        auVar101._8_4_ = auVar41._8_4_ * fVar100;
        auVar101._12_4_ = auVar41._12_4_ * fVar100;
        auVar101._16_4_ = fVar100 * 0.0;
        auVar101._20_4_ = fVar100 * 0.0;
        auVar101._24_4_ = fVar100 * 0.0;
        auVar101._28_4_ = 0;
        auVar41 = vfmadd231ps_fma(auVar101,auVar95,auVar85);
        auVar87 = vsubps_avx512vl(auVar75,auVar77);
        local_1160 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar93,auVar88);
        auVar85 = vsubps_avx512vl(auVar76,auVar78);
        auVar71 = vaddps_avx512vl(auVar74,auVar71);
        auVar74 = vaddps_avx512vl(auVar75,auVar77);
        auVar75 = vaddps_avx512vl(auVar76,auVar78);
        auVar84 = vmulps_avx512vl(auVar74,auVar85);
        auVar84 = vfmsub231ps_avx512vl(auVar84,auVar87,auVar75);
        auVar75 = vmulps_avx512vl(auVar75,auVar86);
        auVar75 = vfmsub231ps_avx512vl(auVar75,auVar85,auVar71);
        auVar76._4_4_ = auVar71._4_4_ * auVar87._4_4_;
        auVar76._0_4_ = auVar71._0_4_ * auVar87._0_4_;
        auVar76._8_4_ = auVar71._8_4_ * auVar87._8_4_;
        auVar76._12_4_ = auVar71._12_4_ * auVar87._12_4_;
        auVar76._16_4_ = auVar71._16_4_ * auVar87._16_4_;
        auVar76._20_4_ = auVar71._20_4_ * auVar87._20_4_;
        auVar76._24_4_ = auVar71._24_4_ * auVar87._24_4_;
        auVar76._28_4_ = auVar71._28_4_;
        auVar71 = vfmsub231ps_avx512vl(auVar76,auVar86,auVar74);
        auVar71 = vmulps_avx512vl(auVar71,auVar98);
        auVar71 = vfmadd231ps_avx512vl(auVar71,auVar95,auVar75);
        auVar84 = vfmadd231ps_avx512vl(auVar71,auVar93,auVar84);
        auVar118._0_4_ = local_1160._0_4_ + auVar40._0_4_;
        auVar118._4_4_ = local_1160._4_4_ + auVar40._4_4_;
        auVar118._8_4_ = local_1160._8_4_ + auVar40._8_4_;
        auVar118._12_4_ = local_1160._12_4_ + auVar40._12_4_;
        auVar118._16_4_ = local_1160._16_4_ + 0.0;
        auVar118._20_4_ = local_1160._20_4_ + 0.0;
        auVar118._24_4_ = local_1160._24_4_ + 0.0;
        auVar118._28_4_ = local_1160._28_4_ + 0.0;
        local_1140 = vaddps_avx512vl(auVar84,auVar118);
        auVar71._8_4_ = 0x7fffffff;
        auVar71._0_8_ = 0x7fffffff7fffffff;
        auVar71._12_4_ = 0x7fffffff;
        auVar71._16_4_ = 0x7fffffff;
        auVar71._20_4_ = 0x7fffffff;
        auVar71._24_4_ = 0x7fffffff;
        auVar71._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_1140,auVar71);
        auVar74._8_4_ = 0x34000000;
        auVar74._0_8_ = 0x3400000034000000;
        auVar74._12_4_ = 0x34000000;
        auVar74._16_4_ = 0x34000000;
        auVar74._20_4_ = 0x34000000;
        auVar74._24_4_ = 0x34000000;
        auVar74._28_4_ = 0x34000000;
        auVar71 = vmulps_avx512vl(local_1140,auVar74);
        auVar74 = vminps_avx512vl(ZEXT1632(auVar40),local_1160);
        auVar74 = vminps_avx512vl(auVar74,auVar84);
        auVar75._8_4_ = 0x80000000;
        auVar75._0_8_ = 0x8000000080000000;
        auVar75._12_4_ = 0x80000000;
        auVar75._16_4_ = 0x80000000;
        auVar75._20_4_ = 0x80000000;
        auVar75._24_4_ = 0x80000000;
        auVar75._28_4_ = 0x80000000;
        auVar75 = vxorps_avx512vl(auVar71,auVar75);
        uVar13 = vcmpps_avx512vl(auVar74,auVar75,5);
        auVar74 = vmaxps_avx512vl(ZEXT1632(auVar40),local_1160);
        auVar74 = vmaxps_avx512vl(auVar74,auVar84);
        uVar14 = vcmpps_avx512vl(auVar74,auVar71,2);
        bVar24 = (byte)uVar13 | (byte)uVar14;
        if (bVar24 != 0) {
          auVar71 = vmulps_avx512vl(auVar82,auVar80);
          auVar74 = vmulps_avx512vl(auVar72,auVar83);
          auVar75 = vmulps_avx512vl(auVar81,auVar79);
          auVar84 = vmulps_avx512vl(auVar87,auVar83);
          auVar76 = vmulps_avx512vl(auVar81,auVar85);
          auVar77 = vmulps_avx512vl(auVar86,auVar82);
          auVar78 = vfmsub213ps_avx512vl(auVar79,auVar83,auVar71);
          auVar79 = vfmsub213ps_avx512vl(auVar80,auVar81,auVar74);
          auVar72 = vfmsub213ps_avx512vl(auVar72,auVar82,auVar75);
          auVar85 = vfmsub213ps_avx512vl(auVar85,auVar82,auVar84);
          auVar86 = vfmsub213ps_avx512vl(auVar86,auVar83,auVar76);
          auVar87 = vfmsub213ps_avx512vl(auVar87,auVar81,auVar77);
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar71,auVar80);
          vandps_avx512vl(auVar84,auVar80);
          uVar39 = vcmpps_avx512vl(auVar80,auVar80,1);
          vandps_avx512vl(auVar74,auVar80);
          vandps_avx512vl(auVar76,auVar80);
          uVar25 = vcmpps_avx512vl(auVar80,auVar80,1);
          vandps_avx512vl(auVar75,auVar80);
          vandps_avx512vl(auVar77,auVar80);
          uVar32 = vcmpps_avx512vl(auVar80,auVar80,1);
          bVar12 = (bool)((byte)uVar39 & 1);
          local_1120._0_4_ = (float)((uint)bVar12 * auVar78._0_4_ | (uint)!bVar12 * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
          local_1120._4_4_ = (float)((uint)bVar12 * auVar78._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar39 >> 2) & 1);
          local_1120._8_4_ = (float)((uint)bVar12 * auVar78._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
          local_1120._12_4_ =
               (float)((uint)bVar12 * auVar78._12_4_ | (uint)!bVar12 * auVar85._12_4_);
          bVar12 = (bool)((byte)(uVar39 >> 4) & 1);
          local_1120._16_4_ =
               (float)((uint)bVar12 * auVar78._16_4_ | (uint)!bVar12 * auVar85._16_4_);
          bVar12 = (bool)((byte)(uVar39 >> 5) & 1);
          local_1120._20_4_ =
               (float)((uint)bVar12 * auVar78._20_4_ | (uint)!bVar12 * auVar85._20_4_);
          bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
          local_1120._24_4_ =
               (float)((uint)bVar12 * auVar78._24_4_ | (uint)!bVar12 * auVar85._24_4_);
          bVar12 = SUB81(uVar39 >> 7,0);
          local_1120._28_4_ = (uint)bVar12 * auVar78._28_4_ | (uint)!bVar12 * auVar85._28_4_;
          bVar12 = (bool)((byte)uVar25 & 1);
          local_1100._0_4_ = (float)((uint)bVar12 * auVar79._0_4_ | (uint)!bVar12 * auVar86._0_4_);
          bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
          local_1100._4_4_ = (float)((uint)bVar12 * auVar79._4_4_ | (uint)!bVar12 * auVar86._4_4_);
          bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
          local_1100._8_4_ = (float)((uint)bVar12 * auVar79._8_4_ | (uint)!bVar12 * auVar86._8_4_);
          bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
          local_1100._12_4_ =
               (float)((uint)bVar12 * auVar79._12_4_ | (uint)!bVar12 * auVar86._12_4_);
          bVar12 = (bool)((byte)(uVar25 >> 4) & 1);
          local_1100._16_4_ =
               (float)((uint)bVar12 * auVar79._16_4_ | (uint)!bVar12 * auVar86._16_4_);
          bVar12 = (bool)((byte)(uVar25 >> 5) & 1);
          local_1100._20_4_ =
               (float)((uint)bVar12 * auVar79._20_4_ | (uint)!bVar12 * auVar86._20_4_);
          bVar12 = (bool)((byte)(uVar25 >> 6) & 1);
          local_1100._24_4_ =
               (float)((uint)bVar12 * auVar79._24_4_ | (uint)!bVar12 * auVar86._24_4_);
          bVar12 = SUB81(uVar25 >> 7,0);
          local_1100._28_4_ = (uint)bVar12 * auVar79._28_4_ | (uint)!bVar12 * auVar86._28_4_;
          bVar12 = (bool)((byte)uVar32 & 1);
          local_10e0._0_4_ = (float)((uint)bVar12 * auVar72._0_4_ | (uint)!bVar12 * auVar87._0_4_);
          bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
          local_10e0._4_4_ = (float)((uint)bVar12 * auVar72._4_4_ | (uint)!bVar12 * auVar87._4_4_);
          bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
          local_10e0._8_4_ = (float)((uint)bVar12 * auVar72._8_4_ | (uint)!bVar12 * auVar87._8_4_);
          bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
          local_10e0._12_4_ =
               (float)((uint)bVar12 * auVar72._12_4_ | (uint)!bVar12 * auVar87._12_4_);
          bVar12 = (bool)((byte)(uVar32 >> 4) & 1);
          local_10e0._16_4_ =
               (float)((uint)bVar12 * auVar72._16_4_ | (uint)!bVar12 * auVar87._16_4_);
          bVar12 = (bool)((byte)(uVar32 >> 5) & 1);
          local_10e0._20_4_ =
               (float)((uint)bVar12 * auVar72._20_4_ | (uint)!bVar12 * auVar87._20_4_);
          bVar12 = (bool)((byte)(uVar32 >> 6) & 1);
          local_10e0._24_4_ =
               (float)((uint)bVar12 * auVar72._24_4_ | (uint)!bVar12 * auVar87._24_4_);
          bVar12 = SUB81(uVar32 >> 7,0);
          local_10e0._28_4_ = (uint)bVar12 * auVar72._28_4_ | (uint)!bVar12 * auVar87._28_4_;
          auVar19._4_4_ = fVar100 * local_10e0._4_4_;
          auVar19._0_4_ = fVar100 * local_10e0._0_4_;
          auVar19._8_4_ = fVar100 * local_10e0._8_4_;
          auVar19._12_4_ = fVar100 * local_10e0._12_4_;
          auVar19._16_4_ = fVar100 * local_10e0._16_4_;
          auVar19._20_4_ = fVar100 * local_10e0._20_4_;
          auVar19._24_4_ = fVar100 * local_10e0._24_4_;
          auVar19._28_4_ = fVar100;
          auVar41 = vfmadd213ps_fma(auVar95,local_1100,auVar19);
          auVar41 = vfmadd213ps_fma(auVar93,local_1120,ZEXT1632(auVar41));
          auVar71 = ZEXT1632(CONCAT412(auVar41._12_4_ + auVar41._12_4_,
                                       CONCAT48(auVar41._8_4_ + auVar41._8_4_,
                                                CONCAT44(auVar41._4_4_ + auVar41._4_4_,
                                                         auVar41._0_4_ + auVar41._0_4_))));
          auVar96._0_4_ = auVar73._0_4_ * local_10e0._0_4_;
          auVar96._4_4_ = auVar73._4_4_ * local_10e0._4_4_;
          auVar96._8_4_ = auVar73._8_4_ * local_10e0._8_4_;
          auVar96._12_4_ = auVar73._12_4_ * local_10e0._12_4_;
          auVar96._16_4_ = auVar73._16_4_ * local_10e0._16_4_;
          auVar96._20_4_ = auVar73._20_4_ * local_10e0._20_4_;
          auVar96._24_4_ = auVar73._24_4_ * local_10e0._24_4_;
          auVar96._28_4_ = 0;
          auVar41 = vfmadd213ps_fma(auVar70,local_1100,auVar96);
          auVar51 = vfmadd213ps_fma(auVar69,local_1120,ZEXT1632(auVar41));
          auVar70 = vrcp14ps_avx512vl(auVar71);
          auVar69._8_4_ = 0x3f800000;
          auVar69._0_8_ = &DAT_3f8000003f800000;
          auVar69._12_4_ = 0x3f800000;
          auVar69._16_4_ = 0x3f800000;
          auVar69._20_4_ = 0x3f800000;
          auVar69._24_4_ = 0x3f800000;
          auVar69._28_4_ = 0x3f800000;
          auVar69 = vfnmadd213ps_avx512vl(auVar70,auVar71,auVar69);
          auVar41 = vfmadd132ps_fma(auVar69,auVar70,auVar70);
          local_1060._28_4_ = fVar100;
          local_1060._0_28_ =
               ZEXT1628(CONCAT412((auVar51._12_4_ + auVar51._12_4_) * auVar41._12_4_,
                                  CONCAT48((auVar51._8_4_ + auVar51._8_4_) * auVar41._8_4_,
                                           CONCAT44((auVar51._4_4_ + auVar51._4_4_) * auVar41._4_4_,
                                                    (auVar51._0_4_ + auVar51._0_4_) * auVar41._0_4_)
                                          )));
          auVar92 = ZEXT3264(local_1060);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar70._4_4_ = uVar1;
          auVar70._0_4_ = uVar1;
          auVar70._8_4_ = uVar1;
          auVar70._12_4_ = uVar1;
          auVar70._16_4_ = uVar1;
          auVar70._20_4_ = uVar1;
          auVar70._24_4_ = uVar1;
          auVar70._28_4_ = uVar1;
          uVar13 = vcmpps_avx512vl(local_1060,auVar70,0xd);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar72._4_4_ = uVar1;
          auVar72._0_4_ = uVar1;
          auVar72._8_4_ = uVar1;
          auVar72._12_4_ = uVar1;
          auVar72._16_4_ = uVar1;
          auVar72._20_4_ = uVar1;
          auVar72._24_4_ = uVar1;
          auVar72._28_4_ = uVar1;
          uVar14 = vcmpps_avx512vl(local_1060,auVar72,2);
          bVar24 = (byte)uVar13 & (byte)uVar14 & bVar24;
          if (bVar24 != 0) {
            uVar39 = vcmpps_avx512vl(auVar71,_DAT_02020f00,4);
            uVar39 = bVar24 & uVar39;
            local_10c0 = (byte)uVar39;
            if (local_10c0 != 0) {
              local_1180 = ZEXT1632(auVar40);
              local_fe0 = 0xf0;
              auVar17._8_4_ = 0x219392ef;
              auVar17._0_8_ = 0x219392ef219392ef;
              auVar17._12_4_ = 0x219392ef;
              auVar17._16_4_ = 0x219392ef;
              auVar17._20_4_ = 0x219392ef;
              auVar17._24_4_ = 0x219392ef;
              auVar17._28_4_ = 0x219392ef;
              uVar25 = vcmpps_avx512vl(local_1140,auVar17,5);
              auVar70 = vrcp14ps_avx512vl(local_1140);
              auVar94._8_4_ = 0x3f800000;
              auVar94._0_8_ = &DAT_3f8000003f800000;
              auVar94._12_4_ = 0x3f800000;
              auVar94._16_4_ = 0x3f800000;
              auVar94._20_4_ = 0x3f800000;
              auVar94._24_4_ = 0x3f800000;
              auVar94._28_4_ = 0x3f800000;
              auVar41 = vfnmadd213ps_fma(local_1140,auVar70,auVar94);
              auVar69 = vfmadd132ps_avx512vl(ZEXT1632(auVar41),auVar70,auVar70);
              fVar106 = (float)((uint)((byte)uVar25 & 1) * auVar69._0_4_);
              fVar100 = (float)((uint)((byte)(uVar25 >> 1) & 1) * auVar69._4_4_);
              fVar105 = (float)((uint)((byte)(uVar25 >> 2) & 1) * auVar69._8_4_);
              fVar104 = (float)((uint)((byte)(uVar25 >> 3) & 1) * auVar69._12_4_);
              fVar103 = (float)((uint)((byte)(uVar25 >> 4) & 1) * auVar69._16_4_);
              fVar102 = (float)((uint)((byte)(uVar25 >> 5) & 1) * auVar69._20_4_);
              fVar107 = (float)((uint)((byte)(uVar25 >> 6) & 1) * auVar69._24_4_);
              auVar91._0_4_ = fVar106 * auVar40._0_4_;
              auVar91._4_4_ = fVar100 * auVar40._4_4_;
              auVar91._8_4_ = fVar105 * auVar40._8_4_;
              auVar91._12_4_ = fVar104 * auVar40._12_4_;
              auVar91._16_4_ = fVar103 * 0.0;
              auVar91._20_4_ = fVar102 * 0.0;
              auVar91._24_4_ = fVar107 * 0.0;
              auVar91._28_4_ = 0;
              auVar69 = vminps_avx(auVar91,auVar94);
              auVar20._4_4_ = local_1160._4_4_ * fVar100;
              auVar20._0_4_ = local_1160._0_4_ * fVar106;
              auVar20._8_4_ = local_1160._8_4_ * fVar105;
              auVar20._12_4_ = local_1160._12_4_ * fVar104;
              auVar20._16_4_ = local_1160._16_4_ * fVar103;
              auVar20._20_4_ = local_1160._20_4_ * fVar102;
              auVar20._24_4_ = local_1160._24_4_ * fVar107;
              auVar20._28_4_ = auVar70._28_4_;
              auVar70 = vminps_avx(auVar20,auVar94);
              auVar71 = vsubps_avx(auVar94,auVar69);
              auVar72 = vsubps_avx(auVar94,auVar70);
              local_1080 = vblendps_avx(auVar70,auVar71,0xf0);
              local_10a0 = vblendps_avx(auVar69,auVar72,0xf0);
              local_1040._4_4_ = local_1120._4_4_ * 1.0;
              local_1040._0_4_ = local_1120._0_4_ * 1.0;
              local_1040._8_4_ = local_1120._8_4_ * 1.0;
              local_1040._12_4_ = local_1120._12_4_ * 1.0;
              local_1040._16_4_ = local_1120._16_4_ * -1.0;
              local_1040._20_4_ = local_1120._20_4_ * -1.0;
              local_1040._24_4_ = local_1120._24_4_ * -1.0;
              local_1040._28_4_ = local_10a0._28_4_;
              local_1020[0] = local_1100._0_4_ * 1.0;
              local_1020[1] = local_1100._4_4_ * 1.0;
              local_1020[2] = local_1100._8_4_ * 1.0;
              local_1020[3] = local_1100._12_4_ * 1.0;
              fStack_1010 = local_1100._16_4_ * -1.0;
              fStack_100c = local_1100._20_4_ * -1.0;
              fStack_1008 = local_1100._24_4_ * -1.0;
              uStack_1004 = local_1100._28_4_;
              local_1000[0] = local_10e0._0_4_ * 1.0;
              local_1000[1] = local_10e0._4_4_ * 1.0;
              local_1000[2] = local_10e0._8_4_ * 1.0;
              local_1000[3] = local_10e0._12_4_ * 1.0;
              fStack_ff0 = local_10e0._16_4_ * -1.0;
              fStack_fec = local_10e0._20_4_ * -1.0;
              fStack_fe8 = local_10e0._24_4_ * -1.0;
              uStack_fe4 = 0xbf800000;
              auVar97._8_4_ = 0x7f800000;
              auVar97._0_8_ = 0x7f8000007f800000;
              auVar97._12_4_ = 0x7f800000;
              auVar97._16_4_ = 0x7f800000;
              auVar97._20_4_ = 0x7f800000;
              auVar97._24_4_ = 0x7f800000;
              auVar97._28_4_ = 0x7f800000;
              auVar99 = ZEXT3264(auVar97);
              auVar69 = vblendmps_avx512vl(auVar97,local_1060);
              auVar89._0_4_ =
                   (uint)(local_10c0 & 1) * auVar69._0_4_ |
                   (uint)!(bool)(local_10c0 & 1) * (int)(local_1120._0_4_ * 1.0);
              bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
              auVar89._4_4_ =
                   (uint)bVar12 * auVar69._4_4_ | (uint)!bVar12 * (int)(local_1120._4_4_ * 1.0);
              bVar12 = (bool)((byte)(uVar39 >> 2) & 1);
              auVar89._8_4_ =
                   (uint)bVar12 * auVar69._8_4_ | (uint)!bVar12 * (int)(local_1120._8_4_ * 1.0);
              bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
              auVar89._12_4_ =
                   (uint)bVar12 * auVar69._12_4_ | (uint)!bVar12 * (int)(local_1120._12_4_ * 1.0);
              bVar12 = (bool)((byte)(uVar39 >> 4) & 1);
              auVar89._16_4_ =
                   (uint)bVar12 * auVar69._16_4_ | (uint)!bVar12 * (int)(local_1120._16_4_ * -1.0);
              bVar12 = (bool)((byte)(uVar39 >> 5) & 1);
              auVar89._20_4_ =
                   (uint)bVar12 * auVar69._20_4_ | (uint)!bVar12 * (int)(local_1120._20_4_ * -1.0);
              bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
              auVar89._24_4_ =
                   (uint)bVar12 * auVar69._24_4_ | (uint)!bVar12 * (int)(local_1120._24_4_ * -1.0);
              bVar12 = SUB81(uVar39 >> 7,0);
              auVar89._28_4_ = (uint)bVar12 * auVar69._28_4_ | (uint)!bVar12 * local_10a0._28_4_;
              auVar69 = vshufps_avx(auVar89,auVar89,0xb1);
              auVar69 = vminps_avx(auVar89,auVar69);
              auVar70 = vshufpd_avx(auVar69,auVar69,5);
              auVar69 = vminps_avx(auVar69,auVar70);
              auVar70 = vpermpd_avx2(auVar69,0x4e);
              auVar69 = vminps_avx(auVar69,auVar70);
              uVar13 = vcmpps_avx512vl(auVar89,auVar69,0);
              bVar24 = local_10c0;
              if (((byte)uVar13 & local_10c0) != 0) {
                bVar24 = (byte)uVar13 & local_10c0;
              }
LAB_00781bef:
              uVar15 = 0;
              for (uVar28 = (uint)bVar24; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                uVar15 = uVar15 + 1;
              }
              uVar28 = *(uint *)(local_fc0 + (ulong)uVar15 * 4);
              pGVar6 = (pSVar4->geometries).items[uVar28].ptr;
              auVar69 = auVar89;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar39 = (ulong)(byte)(~(byte)(1 << (uVar15 & 0x1f)) & (byte)uVar39);
LAB_00781c43:
                bVar12 = true;
              }
              else {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  uVar25 = (ulong)(uVar15 * 4);
                  uVar1 = *(undefined4 *)(local_10a0 + uVar25);
                  local_11e0._4_4_ = uVar1;
                  local_11e0._0_4_ = uVar1;
                  local_11e0._8_4_ = uVar1;
                  local_11e0._12_4_ = uVar1;
                  local_11d0 = *(undefined4 *)(local_1080 + uVar25);
                  local_11b0 = vpbroadcastd_avx512vl();
                  uVar1 = *(undefined4 *)(local_1240 + uVar25);
                  local_11c0._4_4_ = uVar1;
                  local_11c0._0_4_ = uVar1;
                  local_11c0._8_4_ = uVar1;
                  local_11c0._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_1040 + uVar25);
                  uVar3 = *(undefined4 *)((long)local_1020 + uVar25);
                  local_1200._4_4_ = uVar3;
                  local_1200._0_4_ = uVar3;
                  local_1200._8_4_ = uVar3;
                  local_1200._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)((long)local_1000 + uVar25);
                  local_11f0._4_4_ = uVar3;
                  local_11f0._0_4_ = uVar3;
                  local_11f0._8_4_ = uVar3;
                  local_11f0._12_4_ = uVar3;
                  local_1210[0] = (RTCHitN)(char)uVar1;
                  local_1210[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1210[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1210[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1210[4] = (RTCHitN)(char)uVar1;
                  local_1210[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1210[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1210[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1210[8] = (RTCHitN)(char)uVar1;
                  local_1210[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1210[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1210[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1210[0xc] = (RTCHitN)(char)uVar1;
                  local_1210[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1210[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1210[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_11cc = local_11d0;
                  uStack_11c8 = local_11d0;
                  uStack_11c4 = local_11d0;
                  vpcmpeqd_avx2(ZEXT1632(local_11e0),ZEXT1632(local_11e0));
                  uStack_119c = context->user->instID[0];
                  local_11a0 = uStack_119c;
                  uStack_1198 = uStack_119c;
                  uStack_1194 = uStack_119c;
                  uStack_1190 = context->user->instPrimID[0];
                  uStack_118c = uStack_1190;
                  uStack_1188 = uStack_1190;
                  uStack_1184 = uStack_1190;
                  uVar2 = *(uint *)(ray + k * 4 + 0x80);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar25);
                  local_1390 = local_12f0._0_8_;
                  uStack_1388 = local_12f0._8_8_;
                  local_1340.valid = (int *)&local_1390;
                  local_1340.geometryUserPtr = pGVar6->userPtr;
                  local_1340.context = context->user;
                  local_1340.hit = local_1210;
                  local_1340.N = 4;
                  local_1260 = auVar92._0_32_;
                  local_1340.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar6->intersectionFilterN)(&local_1340);
                    auVar92 = ZEXT3264(local_1260);
                    auVar99 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar128 = ZEXT1664(local_1310);
                    auVar127 = ZEXT1664(local_1300);
                  }
                  auVar46._8_8_ = uStack_1388;
                  auVar46._0_8_ = local_1390;
                  uVar25 = vptestmd_avx512vl(auVar46,auVar46);
                  if ((uVar25 & 0xf) == 0) {
LAB_00781f2c:
                    auVar69 = ZEXT432(uVar2);
                    *(uint *)(ray + k * 4 + 0x80) = uVar2;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_1340);
                      auVar92 = ZEXT3264(local_1260);
                      auVar99 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar128 = ZEXT1664(local_1310);
                      auVar127 = ZEXT1664(local_1300);
                    }
                    auVar47._8_8_ = uStack_1388;
                    auVar47._0_8_ = local_1390;
                    uVar25 = vptestmd_avx512vl(auVar47,auVar47);
                    uVar25 = uVar25 & 0xf;
                    bVar24 = (byte)uVar25;
                    if (bVar24 == 0) goto LAB_00781f2c;
                    iVar30 = *(int *)(local_1340.hit + 4);
                    iVar21 = *(int *)(local_1340.hit + 8);
                    iVar22 = *(int *)(local_1340.hit + 0xc);
                    bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
                    bVar11 = SUB81(uVar25 >> 3,0);
                    *(uint *)(local_1340.ray + 0xc0) =
                         (uint)(bVar24 & 1) * *(int *)local_1340.hit |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_1340.ray + 0xc0);
                    *(uint *)(local_1340.ray + 0xc4) =
                         (uint)bVar12 * iVar30 | (uint)!bVar12 * *(int *)(local_1340.ray + 0xc4);
                    *(uint *)(local_1340.ray + 200) =
                         (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1340.ray + 200);
                    *(uint *)(local_1340.ray + 0xcc) =
                         (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1340.ray + 0xcc);
                    iVar30 = *(int *)(local_1340.hit + 0x14);
                    iVar21 = *(int *)(local_1340.hit + 0x18);
                    iVar22 = *(int *)(local_1340.hit + 0x1c);
                    bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
                    bVar11 = SUB81(uVar25 >> 3,0);
                    *(uint *)(local_1340.ray + 0xd0) =
                         (uint)(bVar24 & 1) * *(int *)(local_1340.hit + 0x10) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_1340.ray + 0xd0);
                    *(uint *)(local_1340.ray + 0xd4) =
                         (uint)bVar12 * iVar30 | (uint)!bVar12 * *(int *)(local_1340.ray + 0xd4);
                    *(uint *)(local_1340.ray + 0xd8) =
                         (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1340.ray + 0xd8);
                    *(uint *)(local_1340.ray + 0xdc) =
                         (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1340.ray + 0xdc);
                    iVar30 = *(int *)(local_1340.hit + 0x24);
                    iVar21 = *(int *)(local_1340.hit + 0x28);
                    iVar22 = *(int *)(local_1340.hit + 0x2c);
                    bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
                    bVar11 = SUB81(uVar25 >> 3,0);
                    *(uint *)(local_1340.ray + 0xe0) =
                         (uint)(bVar24 & 1) * *(int *)(local_1340.hit + 0x20) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_1340.ray + 0xe0);
                    *(uint *)(local_1340.ray + 0xe4) =
                         (uint)bVar12 * iVar30 | (uint)!bVar12 * *(int *)(local_1340.ray + 0xe4);
                    *(uint *)(local_1340.ray + 0xe8) =
                         (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1340.ray + 0xe8);
                    *(uint *)(local_1340.ray + 0xec) =
                         (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1340.ray + 0xec);
                    iVar30 = *(int *)(local_1340.hit + 0x34);
                    iVar21 = *(int *)(local_1340.hit + 0x38);
                    iVar22 = *(int *)(local_1340.hit + 0x3c);
                    bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
                    bVar11 = SUB81(uVar25 >> 3,0);
                    *(uint *)(local_1340.ray + 0xf0) =
                         (uint)(bVar24 & 1) * *(int *)(local_1340.hit + 0x30) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_1340.ray + 0xf0);
                    *(uint *)(local_1340.ray + 0xf4) =
                         (uint)bVar12 * iVar30 | (uint)!bVar12 * *(int *)(local_1340.ray + 0xf4);
                    *(uint *)(local_1340.ray + 0xf8) =
                         (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1340.ray + 0xf8);
                    *(uint *)(local_1340.ray + 0xfc) =
                         (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1340.ray + 0xfc);
                    iVar30 = *(int *)(local_1340.hit + 0x44);
                    iVar21 = *(int *)(local_1340.hit + 0x48);
                    iVar22 = *(int *)(local_1340.hit + 0x4c);
                    bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
                    bVar11 = SUB81(uVar25 >> 3,0);
                    *(uint *)(local_1340.ray + 0x100) =
                         (uint)(bVar24 & 1) * *(int *)(local_1340.hit + 0x40) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_1340.ray + 0x100);
                    *(uint *)(local_1340.ray + 0x104) =
                         (uint)bVar12 * iVar30 | (uint)!bVar12 * *(int *)(local_1340.ray + 0x104);
                    *(uint *)(local_1340.ray + 0x108) =
                         (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_1340.ray + 0x108);
                    *(uint *)(local_1340.ray + 0x10c) =
                         (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(local_1340.ray + 0x10c);
                    auVar40 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x50));
                    *(undefined1 (*) [16])(local_1340.ray + 0x110) = auVar40;
                    auVar40 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x60));
                    *(undefined1 (*) [16])(local_1340.ray + 0x120) = auVar40;
                    auVar40 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x70));
                    *(undefined1 (*) [16])(local_1340.ray + 0x130) = auVar40;
                    auVar69 = ZEXT1632(*(undefined1 (*) [16])(local_1340.hit + 0x80));
                    auVar40 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_1340.hit + 0x80));
                    *(undefined1 (*) [16])(local_1340.ray + 0x140) = auVar40;
                  }
                  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar18._4_4_ = uVar1;
                  auVar18._0_4_ = uVar1;
                  auVar18._8_4_ = uVar1;
                  auVar18._12_4_ = uVar1;
                  auVar18._16_4_ = uVar1;
                  auVar18._20_4_ = uVar1;
                  auVar18._24_4_ = uVar1;
                  auVar18._28_4_ = uVar1;
                  uVar25 = vcmpps_avx512vl(auVar92._0_32_,auVar18,2);
                  uVar39 = (byte)(~(byte)(1 << (uVar15 & 0x1f)) & (byte)uVar39) & uVar25;
                  goto LAB_00781c43;
                }
                bVar12 = false;
              }
              if (bVar12) {
                bVar24 = (byte)uVar39;
                if (bVar24 == 0) goto LAB_0078200d;
                auVar70 = vblendmps_avx512vl(auVar99._0_32_,auVar92._0_32_);
                auVar89._0_4_ =
                     (uint)(bVar24 & 1) * auVar70._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar69._0_4_;
                bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
                auVar89._4_4_ = (uint)bVar12 * auVar70._4_4_ | (uint)!bVar12 * auVar69._4_4_;
                bVar12 = (bool)((byte)(uVar39 >> 2) & 1);
                auVar89._8_4_ = (uint)bVar12 * auVar70._8_4_ | (uint)!bVar12 * auVar69._8_4_;
                bVar12 = (bool)((byte)(uVar39 >> 3) & 1);
                auVar89._12_4_ = (uint)bVar12 * auVar70._12_4_ | (uint)!bVar12 * auVar69._12_4_;
                bVar12 = (bool)((byte)(uVar39 >> 4) & 1);
                auVar89._16_4_ = (uint)bVar12 * auVar70._16_4_ | (uint)!bVar12 * auVar69._16_4_;
                bVar12 = (bool)((byte)(uVar39 >> 5) & 1);
                auVar89._20_4_ = (uint)bVar12 * auVar70._20_4_ | (uint)!bVar12 * auVar69._20_4_;
                bVar12 = (bool)((byte)(uVar39 >> 6) & 1);
                auVar89._24_4_ = (uint)bVar12 * auVar70._24_4_ | (uint)!bVar12 * auVar69._24_4_;
                bVar12 = SUB81(uVar39 >> 7,0);
                auVar89._28_4_ = (uint)bVar12 * auVar70._28_4_ | (uint)!bVar12 * auVar69._28_4_;
                auVar69 = vshufps_avx(auVar89,auVar89,0xb1);
                auVar69 = vminps_avx(auVar89,auVar69);
                auVar70 = vshufpd_avx(auVar69,auVar69,5);
                auVar69 = vminps_avx(auVar69,auVar70);
                auVar70 = vpermpd_avx2(auVar69,0x4e);
                auVar69 = vminps_avx(auVar69,auVar70);
                uVar13 = vcmpps_avx512vl(auVar89,auVar69,0);
                bVar27 = (byte)uVar13 & bVar24;
                if (bVar27 != 0) {
                  bVar24 = bVar27;
                }
                goto LAB_00781bef;
              }
              uVar39 = (ulong)(uVar15 << 2);
              uVar1 = *(undefined4 *)(local_10a0 + uVar39);
              uVar3 = *(undefined4 *)(local_1080 + uVar39);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1060 + uVar39);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1040 + uVar39);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_1020 + uVar39);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_1000 + uVar39);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(local_1240 + uVar39);
              *(uint *)(ray + k * 4 + 0x120) = uVar28;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
        }
LAB_0078200d:
        local_1348 = local_1348 + 1;
      } while (local_1348 != local_1360);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar92 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    auVar99 = ZEXT1664(local_1270);
    auVar126 = ZEXT1664(local_12e0);
    uVar34 = local_1378;
    uVar39 = local_1380;
    fVar100 = local_1280;
    fVar102 = fStack_127c;
    fVar103 = fStack_1278;
    fVar104 = fStack_1274;
    fVar105 = local_1290;
    fVar106 = fStack_128c;
    fVar107 = fStack_1288;
    fVar108 = fStack_1284;
    fVar109 = local_12a0;
    fVar110 = fStack_129c;
    fVar111 = fStack_1298;
    fVar112 = fStack_1294;
    fVar113 = local_12b0;
    fVar114 = fStack_12ac;
    fVar115 = fStack_12a8;
    fVar116 = fStack_12a4;
    fVar117 = local_12c0;
    fVar119 = fStack_12bc;
    fVar120 = fStack_12b8;
    fVar121 = fStack_12b4;
    fVar122 = local_12d0;
    fVar123 = fStack_12cc;
    fVar124 = fStack_12c8;
    fVar125 = fStack_12c4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }